

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::presolve(Highs *this)

{
  uint uVar1;
  bool bVar2;
  HighsStatus HVar3;
  uint uVar4;
  HighsStatus highs_return_status;
  Highs *this_00;
  Highs *this_01;
  string local_40;
  
  this_00 = (Highs *)&this->model_;
  bVar2 = HighsLp::needsMods((HighsLp *)this_00,
                             (this->options_).super_HighsOptionsStruct.infinite_cost);
  if (bVar2) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Model contains infinite costs or semi-variables, so cannot be presolved independently\n"
                );
    return kError;
  }
  reportModelStats(this);
  clearPresolve(this);
  if ((this->model_).lp_.num_row_ == 0 && (this->model_).lp_.num_col_ == 0) {
    this->model_presolve_status_ = kNotReduced;
switchD_00232b0b_caseD_0:
    HighsModel::operator=(&this->presolved_model_,(HighsModel *)this_00);
    this_01 = this_00;
    goto switchD_00232b0b_caseD_2;
  }
  ::highs::parallel::initialize_scheduler((this->options_).super_HighsOptionsStruct.threads);
  uVar4 = ::highs::parallel::num_threads();
  this->max_threads = uVar4;
  uVar1 = (this->options_).super_HighsOptionsStruct.threads;
  if (uVar4 != uVar1 && uVar1 != 0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Option \'threads\' is set to %d but global scheduler has already been initialized to use %d threads. The previous scheduler instance can be destroyed by calling Highs::resetGlobalScheduler().\n"
                 ,(ulong)uVar1,(ulong)uVar4);
    return kError;
  }
  this_01 = (Highs *)0x0;
  highs_return_status = runPresolve(this,false,true);
  this->model_presolve_status_ = highs_return_status;
  HVar3 = kWarning;
  switch(highs_return_status) {
  case kOk:
    goto switchD_00232b0b_caseD_0;
  case kWarning:
    this_01 = (Highs *)0x8;
    setHighsModelStatusAndClearSolutionAndBasis(this,kInfeasible);
  case 2:
switchD_00232b0b_caseD_2:
    highs_return_status = kOk;
    break;
  case 3:
  case 4:
    HVar3 = kOk;
  case 5:
    highs_return_status = HVar3;
    this_01 = (Highs *)&(this->presolve_).data_.reduced_lp_;
    HighsLp::operator=(&(this->presolved_model_).lp_,(HighsLp *)this_01);
    HighsLp::setMatrixDimensions(&(this->presolved_model_).lp_);
    break;
  case kError:
    break;
  default:
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Presolve fails due to memory allocation error\n");
    this_01 = (Highs *)0x3;
    setHighsModelStatusAndClearSolutionAndBasis(this,kPresolveError);
    highs_return_status = kError;
  }
  presolveStatusToString_abi_cxx11_(&local_40,this_01,this->model_presolve_status_);
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,"Presolve status: %s\n",
               local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  HVar3 = returnFromHighs(this,highs_return_status);
  return HVar3;
}

Assistant:

HighsStatus Highs::presolve() {
  if (model_.needsMods(options_.infinite_cost)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model contains infinite costs or semi-variables, so cannot "
                 "be presolved independently\n");
    return HighsStatus::kError;
  }
  HighsStatus return_status = HighsStatus::kOk;

  this->reportModelStats();
  clearPresolve();
  if (model_.isEmpty()) {
    model_presolve_status_ = HighsPresolveStatus::kNotReduced;
  } else {
    const bool force_presolve = true;
    // make sure global scheduler is initialized before calling presolve, since
    // MIP presolve may use parallelism
    highs::parallel::initialize_scheduler(options_.threads);
    max_threads = highs::parallel::num_threads();
    if (options_.threads != 0 && max_threads != options_.threads) {
      highsLogUser(
          options_.log_options, HighsLogType::kError,
          "Option 'threads' is set to %d but global scheduler has already been "
          "initialized to use %d threads. The previous scheduler instance can "
          "be destroyed by calling Highs::resetGlobalScheduler().\n",
          (int)options_.threads, max_threads);
      return HighsStatus::kError;
    }
    const bool force_lp_presolve = false;
    model_presolve_status_ = runPresolve(force_lp_presolve, force_presolve);
  }

  bool using_reduced_lp = false;
  switch (model_presolve_status_) {
    case HighsPresolveStatus::kNotPresolved: {
      // Shouldn't happen
      assert(model_presolve_status_ != HighsPresolveStatus::kNotPresolved);
      return_status = HighsStatus::kError;
      break;
    }
    case HighsPresolveStatus::kNotReduced:
    case HighsPresolveStatus::kInfeasible:
    case HighsPresolveStatus::kReduced:
    case HighsPresolveStatus::kReducedToEmpty:
    case HighsPresolveStatus::kUnboundedOrInfeasible: {
      // All OK
      if (model_presolve_status_ == HighsPresolveStatus::kInfeasible) {
        // Infeasible model, so indicate that the incumbent model is
        // known as such
        setHighsModelStatusAndClearSolutionAndBasis(
            HighsModelStatus::kInfeasible);
      } else if (model_presolve_status_ == HighsPresolveStatus::kNotReduced) {
        // No reduction, so fill Highs presolved model with the
        // incumbent model
        presolved_model_ = model_;
      } else if (model_presolve_status_ == HighsPresolveStatus::kReduced ||
                 model_presolve_status_ ==
                     HighsPresolveStatus::kReducedToEmpty) {
        // Nontrivial reduction, so fill Highs presolved model with the
        // presolved model
        using_reduced_lp = true;
      }
      return_status = HighsStatus::kOk;
      break;
    }
    case HighsPresolveStatus::kTimeout: {
      // Timeout, so assume that it's OK to fill the Highs presolved model with
      // the presolved model, but return warning.
      using_reduced_lp = true;
      return_status = HighsStatus::kWarning;
      break;
    }
    default: {
      // case HighsPresolveStatus::kOutOfMemory
      assert(model_presolve_status_ == HighsPresolveStatus::kOutOfMemory);
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Presolve fails due to memory allocation error\n");
      setHighsModelStatusAndClearSolutionAndBasis(
          HighsModelStatus::kPresolveError);
      return_status = HighsStatus::kError;
    }
  }
  if (using_reduced_lp) {
    presolved_model_.lp_ = presolve_.getReducedProblem();
    presolved_model_.lp_.setMatrixDimensions();
  }

  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Presolve status: %s\n",
               presolveStatusToString(model_presolve_status_).c_str());
  return returnFromHighs(return_status);
}